

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O0

void __thiscall JUnitTestOutput::resetTestGroupResult(JUnitTestOutput *this)

{
  JUnitTestCaseResultNode *pJVar1;
  JUnitTestCaseResultNode *tmp;
  JUnitTestCaseResultNode *cur;
  SimpleString local_20;
  JUnitTestOutput *local_10;
  JUnitTestOutput *this_local;
  
  (this->impl_->results_).testCount_ = 0;
  (this->impl_->results_).failureCount_ = 0;
  local_10 = this;
  SimpleString::SimpleString(&local_20,"");
  SimpleString::operator=(&(this->impl_->results_).group_,&local_20);
  SimpleString::~SimpleString(&local_20);
  pJVar1 = (this->impl_->results_).head_;
  while (tmp = pJVar1, tmp != (JUnitTestCaseResultNode *)0x0) {
    pJVar1 = tmp->next_;
    if (tmp->failure_ != (TestFailure *)0x0) {
      (*tmp->failure_->_vptr_TestFailure[1])();
    }
    if (tmp != (JUnitTestCaseResultNode *)0x0) {
      JUnitTestCaseResultNode::~JUnitTestCaseResultNode(tmp);
      operator_delete(tmp,0x50);
    }
  }
  (this->impl_->results_).head_ = (JUnitTestCaseResultNode *)0x0;
  (this->impl_->results_).tail_ = (JUnitTestCaseResultNode *)0x0;
  return;
}

Assistant:

void JUnitTestOutput::resetTestGroupResult()
{
    impl_->results_.testCount_ = 0;
    impl_->results_.failureCount_ = 0;
    impl_->results_.group_ = "";
    JUnitTestCaseResultNode* cur = impl_->results_.head_;
    while (cur) {
        JUnitTestCaseResultNode* tmp = cur->next_;
        delete cur->failure_;
        delete cur;
        cur = tmp;
    }
    impl_->results_.head_ = NULLPTR;
    impl_->results_.tail_ = NULLPTR;
}